

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::QScrollBar(QScrollBar *this,Orientation orientation,QWidget *parent)

{
  QScrollBarPrivate *this_00;
  QScrollBarPrivate *pQVar1;
  QAbstractSliderPrivate *in_RDX;
  Orientation in_ESI;
  QWidget *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (QScrollBarPrivate *)operator_new(0x2c0);
  QScrollBarPrivate::QScrollBarPrivate(this_00);
  QAbstractSlider::QAbstractSlider
            ((QAbstractSlider *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RDI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d1a020;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QScrollBar_00d1a1e0;
  pQVar1 = d_func((QScrollBar *)0x67b75c);
  (pQVar1->super_QAbstractSliderPrivate).orientation = in_ESI;
  pQVar1 = d_func((QScrollBar *)0x67b770);
  QScrollBarPrivate::init(pQVar1,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QScrollBar::QScrollBar(Qt::Orientation orientation, QWidget *parent)
    : QAbstractSlider(*new QScrollBarPrivate, parent)
{
    d_func()->orientation = orientation;
    d_func()->init();
}